

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

int Gia_ManArePrintUsed_rec(Gia_ManAre_t *p,Gia_PtrAre_t Root,int fTree)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint **ppuVar5;
  int iVar6;
  uint fTree_00;
  Gia_StaAre_t *pSta;
  ulong uVar7;
  
  iVar6 = 0;
  while (uVar2 = (uint)Root >> 0x14 & 0x7ff, fTree != 0) {
    puVar1 = p->ppObjs[uVar2];
    uVar7 = (ulong)(((uint)Root & 0xfffff) << 2);
    fTree_00 = 0;
    uVar2 = 0;
    if ((*(ushort *)((long)puVar1 + uVar7 * 4 + 1) & 0xfc0) == 0) {
      uVar2 = 1;
      if ((puVar1[uVar7 + 1] & 0x7ff00000) == 0) {
        uVar2 = (uint)((puVar1[uVar7 + 1] & 0xfffff) != 0);
      }
    }
    iVar3 = Gia_ManArePrintUsed_rec(p,*(Gia_PtrAre_t *)(puVar1 + uVar7 + 1),uVar2);
    if ((*(ushort *)((long)puVar1 + uVar7 * 4 + 2) & 0x3f0) == 0) {
      fTree_00 = 1;
      if ((puVar1[uVar7 + 2] & 0x7ff00000) == 0) {
        fTree_00 = (uint)((puVar1[uVar7 + 2] & 0xfffff) != 0);
      }
    }
    iVar4 = Gia_ManArePrintUsed_rec(p,*(Gia_PtrAre_t *)(puVar1 + uVar7 + 2),fTree_00);
    fTree = 0;
    if (puVar1[uVar7] < 0x4000000) {
      fTree = 1;
      if ((puVar1[uVar7 + 3] & 0x7ff00000) == 0) {
        fTree = (int)((puVar1[uVar7 + 3] & 0xfffff) != 0);
      }
    }
    Root = *(Gia_PtrAre_t *)(puVar1 + uVar7 + 3);
    iVar6 = iVar6 + iVar4 + iVar3;
  }
  ppuVar5 = p->ppStas;
  for (pSta = (Gia_StaAre_t *)(ppuVar5[uVar2] + (long)p->nSize * (ulong)((uint)Root & 0xfffff));
      (Gia_StaAre_t *)*ppuVar5 != pSta;
      pSta = (Gia_StaAre_t *)
             ((long)p->nSize * (ulong)((uint)pSta->iNext & 0xfffff) * 4 +
             *(long *)((long)ppuVar5 + (ulong)((uint)pSta->iNext >> 0x11 & 0x3ff8)))) {
    if (-1 < (int)pSta->iPrev) {
      Gia_ManArePrintCube(p,pSta);
    }
    ppuVar5 = p->ppStas;
  }
  return iVar6 + 1;
}

Assistant:

int Gia_ManArePrintUsed_rec( Gia_ManAre_t * p, Gia_PtrAre_t Root, int fTree )
{
    Gia_ObjAre_t * pObj;
    if ( !fTree )
        return Gia_ManArePrintListUsed( p, Root );
    pObj = Gia_ManAreObj(p, Root);
    return Gia_ManArePrintUsed_rec( p, pObj->F[0], Gia_ObjHasBranch0(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[1], Gia_ObjHasBranch1(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[2], Gia_ObjHasBranch2(pObj) );
}